

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

int traverseephemeron(global_State *g,Table *h)

{
  GCObject *pGVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Node *pNVar7;
  long lVar8;
  Node *pNVar9;
  bool bVar10;
  int local_34;
  
  pNVar7 = h->node;
  pNVar9 = pNVar7 + (1 << (h->lsizenode & 0x1f));
  uVar5 = h->sizearray;
  if (uVar5 == 0) {
    local_34 = 0;
  }
  else {
    uVar6 = 0;
    lVar8 = 8;
    local_34 = 0;
    do {
      if (((*(byte *)((long)&h->array->value_ + lVar8) & 0x40) != 0) &&
         (pGVar1 = *(GCObject **)((long)h->array + lVar8 + -8), (pGVar1->marked & 3) != 0)) {
        reallymarkobject(g,pGVar1);
        uVar5 = h->sizearray;
        local_34 = 1;
      }
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar6 < uVar5);
    pNVar7 = h->node;
  }
  if (pNVar7 < pNVar9) {
    bVar2 = false;
    bVar3 = false;
    do {
      if ((pNVar7->i_val).tt_ == 0) {
        if (((undefined1  [16])((undefined1  [16])pNVar7->i_key & (undefined1  [16])0x40) !=
             (undefined1  [16])0x0) && ((((pNVar7->i_key).nk.value_.gc)->marked & 3) != 0)) {
          (pNVar7->i_key).nk.tt_ = 10;
        }
      }
      else {
        iVar4 = iscleared(g,&(pNVar7->i_key).tvk);
        uVar5 = (pNVar7->i_val).tt_;
        if (iVar4 == 0) {
          if (((uVar5 & 0x40) != 0) &&
             (pGVar1 = (pNVar7->i_val).value_.gc, (pGVar1->marked & 3) != 0)) {
            reallymarkobject(g,pGVar1);
            local_34 = 1;
          }
        }
        else {
          bVar3 = true;
          if (((uVar5 & 0x40) != 0) && ((((pNVar7->i_val).value_.gc)->marked & 3) != 0)) {
            bVar2 = true;
          }
        }
      }
      pNVar7 = pNVar7 + 1;
    } while (pNVar7 < pNVar9);
    bVar10 = g->gcstate != '\0';
    lVar8 = 0x78;
    if (bVar10) {
      lVar8 = (ulong)!bVar2 * 8 + 0x88;
    }
    if (bVar10 && (!bVar3 && !bVar2)) {
      return local_34;
    }
  }
  else {
    if (g->gcstate != '\0') {
      return local_34;
    }
    lVar8 = 0x78;
  }
  h->gclist = *(GCObject **)((long)&g->frealloc + lVar8);
  *(Table **)((long)&g->frealloc + lVar8) = h;
  return local_34;
}

Assistant:

static int traverseephemeron(global_State *g, Table *h) {
    int marked = 0;  /* true if an object is marked in this traversal */
    int hasclears = 0;  /* true if table has white keys */
    int hasww = 0;  /* true if table has entry "white-key -> white-value" */
    Node *n, *limit = gnodelast(h);
    unsigned int i;
    /* traverse array part */
    for (i = 0; i < h->sizearray; i++) {
        if (valiswhite(&h->array[i])) {
            marked = 1;
            reallymarkobject(g, gcvalue(&h->array[i]));
        }
    }
    /* traverse hash part */
    for (n = gnode(h, 0); n < limit; n++) {
        checkdeadkey(n);
        if (ttisnil(gval(n)))  /* entry is empty? */
            removeentry(n);  /* remove it */
        else if (iscleared(g, gkey(n))) {  /* key is not marked (yet)? */
            hasclears = 1;  /* table must be cleared */
            if (valiswhite(gval(n)))  /* value not marked yet? */
                hasww = 1;  /* white-white entry */
        } else if (valiswhite(gval(n))) {  /* value not marked yet? */
            marked = 1;
            reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
        }
    }
    /* link table into proper list */
    if (g->gcstate == GCSpropagate)
        linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
    else if (hasww)  /* table has white->white entries? */
        linkgclist(h, g->ephemeron);  /* have to propagate again */
    else if (hasclears)  /* table has white keys? */
        linkgclist(h, g->allweak);  /* may have to clean white keys */
    return marked;
}